

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  uv_stream_t *stream;
  uv_process_t *puVar6;
  __pid_t _Var7;
  int iVar8;
  int (*pipes) [2];
  long *plVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  int (*fds) [2];
  long lVar13;
  ulong uVar14;
  long lVar15;
  int signal_pipe [2];
  int exec_errorno;
  undefined8 local_68;
  ulong local_60;
  uint local_54;
  uv_loop_t *local_50;
  uv_process_t *local_48;
  void **local_40;
  ulong local_38;
  
  local_68 = 0xffffffffffffffff;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL","src/unix/process.c",0x16a,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,"src/unix/process.c",0x16f,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  plVar9 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar9;
  *plVar9 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  uVar11 = 3;
  if (3 < options->stdio_count) {
    uVar11 = (ulong)(uint)options->stdio_count;
  }
  pipes = (int (*) [2])malloc(uVar11 * 8);
  local_38 = uVar11;
  if (pipes == (int (*) [2])0x0) {
    uVar12 = 0xfffffff4;
  }
  else {
    local_60 = uVar11;
    local_50 = loop;
    local_48 = process;
    local_40 = ppvVar1;
    memset(pipes,0xff,uVar11 * 8);
    if (0 < options->stdio_count) {
      lVar15 = 8;
      lVar13 = 0;
      fds = pipes;
      do {
        puVar4 = options->stdio;
        uVar3 = *(uint *)((long)puVar4 + lVar15 + -8);
        uVar12 = uVar3 & 7;
        switch(uVar12) {
        case 0:
          break;
        case 1:
          lVar5 = *(long *)((long)&puVar4->flags + lVar15);
          if (lVar5 == 0) {
            __assert_fail("container->data.stream != NULL","src/unix/process.c",0xca,
                          "int uv__process_init_stdio(uv_stdio_container_t *, int *)");
          }
          uVar12 = 0xffffffea;
          if (*(int *)(lVar5 + 0x18) == 7) {
            uVar12 = uv__make_socketpair(*fds,0);
          }
          break;
        case 2:
        case 4:
          plVar9 = (long *)((long)&puVar4->flags + lVar15);
          if ((uVar3 & 2) == 0) {
            plVar9 = (long *)(*plVar9 + 0xa0);
          }
          if ((int)*plVar9 == -1) {
            uVar12 = 0xffffffea;
          }
          else {
            (*fds)[1] = (int)*plVar9;
            uVar12 = 0;
          }
          break;
        default:
          __assert_fail("0 && \"Unexpected flags\"","src/unix/process.c",0xde,
                        "int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (uVar12 != 0) goto LAB_0010d9d0;
        lVar13 = lVar13 + 1;
        fds = fds + 1;
        lVar15 = lVar15 + 0x10;
      } while (lVar13 < options->stdio_count);
    }
    uVar12 = uv__make_pipe((int *)&local_68,0);
    if (uVar12 == 0) {
      uv_signal_start(&local_50->child_watcher,uv__chld,0x11);
      _Var7 = fork();
      puVar6 = local_48;
      if (_Var7 != -1) {
        if (_Var7 == 0) {
          uv__process_child_init(options,(int)local_60,pipes,local_68._4_4_);
LAB_0010db16:
          __assert_fail("pid > 0","src/unix/process.c",0x2d,
                        "QUEUE *uv__process_queue(uv_loop_t *, int)");
        }
        uv__close(local_68._4_4_);
        puVar6->status = 0;
        local_54 = 0;
        do {
          uVar11 = read((int)local_68,&local_54,4);
          if (uVar11 != 0xffffffffffffffff) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        local_60 = CONCAT44(local_60._4_4_,_Var7);
        if (((uVar11 & 0xfffffffffffffffb) != 0) &&
           ((uVar11 != 0xffffffffffffffff || (piVar10 = __errno_location(), *piVar10 != 0x20)))) {
LAB_0010dafd:
          abort();
        }
        uv__close((int)local_68);
        if (0 < options->stdio_count) {
          lVar13 = 0;
          lVar15 = 0;
          do {
            puVar4 = options->stdio;
            uVar12 = 0;
            if (((*(byte *)((long)&puVar4->flags + lVar13) & 1) != 0) &&
               (uVar12 = 0, -1 < pipes[lVar15][0])) {
              iVar8 = uv__close(pipes[lVar15][1]);
              if (iVar8 != 0) {
                piVar10 = __errno_location();
                if ((*piVar10 != 4) && (*piVar10 != 0x73)) goto LAB_0010dafd;
              }
              pipes[lVar15][1] = -1;
              uv__nonblock(pipes[lVar15][0],1);
              stream = *(uv_stream_t **)((long)&puVar4->data + lVar13);
              if ((stream->type != UV_NAMED_PIPE) ||
                 (iVar8 = 0x60, *(int *)&stream[1].close_cb == 0)) {
                iVar8 = (uint)(lVar13 == 0) * 0x20 + 0x20;
              }
              uVar12 = uv__stream_open(stream,pipes[lVar15][0],iVar8);
            }
            if (uVar12 != 0) goto joined_r0x0010da5a;
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 0x10;
          } while (lVar15 < options->stdio_count);
        }
        if (local_54 == 0) {
          if ((int)local_60 < 1) goto LAB_0010db16;
          local_48->queue[0] = local_50->process_handles;
          plVar9 = (long *)local_50->process_handles[0][1];
          local_48->queue[1] = plVar9;
          *plVar9 = (long)local_40;
          local_50->process_handles[0][1] = local_40;
          uVar12 = local_48->flags;
          if (((uVar12 >> 0xe & 1) == 0) &&
             (local_48->flags = uVar12 | 0x4000, (uVar12 >> 0xd & 1) != 0)) {
            puVar2 = &local_48->loop->active_handles;
            *puVar2 = *puVar2 + 1;
          }
        }
        local_48->pid = (int)local_60;
        local_48->exit_cb = options->exit_cb;
        uVar12 = local_54;
        goto LAB_0010da1c;
      }
      piVar10 = __errno_location();
      uVar12 = -*piVar10;
      uv__close((int)local_68);
      uv__close(local_68._4_4_);
    }
  }
LAB_0010d9d0:
  uVar11 = local_38;
  if (pipes == (int (*) [2])0x0) {
    return uVar12;
  }
  uVar14 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar14) ||
       ((options->stdio[uVar14].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar14][0] != -1) {
        close(pipes[uVar14][0]);
      }
      if (pipes[uVar14][1] != -1) {
        close(pipes[uVar14][1]);
      }
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar11);
LAB_0010da1c:
  free(pipes);
  return uVar12;
joined_r0x0010da5a:
  for (; lVar13 != 0; lVar13 = lVar13 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar13) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar13 + -8));
    }
  }
  goto LAB_0010d9d0;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  QUEUE* q;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno))
    ; /* okay, read errorno */
  else if (r == -1 && errno == EPIPE)
    ; /* okay, got EPIPE */
  else
    abort();

  uv__close(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    q = uv__process_queue(loop, pid);
    QUEUE_INSERT_TAIL(q, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        close(pipes[i][0]);
      if (pipes[i][1] != -1)
        close(pipes[i][1]);
    }
    free(pipes);
  }

  return err;
}